

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteProjectLine
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmGeneratorTarget *target,
          cmLocalGenerator *root,string *rootBinaryDir)

{
  bool bVar1;
  char *__rhs;
  char *pcVar2;
  cmLocalGenerator *this_00;
  string *psVar3;
  ostream *poVar4;
  string dir;
  string projFile;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GENERATOR_FILE_NAME",(allocator<char> *)&local_70);
  __rhs = cmGeneratorTarget::GetProperty(target,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GENERATOR_FILE_NAME_EXT",(allocator<char> *)&local_70);
  pcVar2 = cmGeneratorTarget::GetProperty(target,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (pcVar2 == (char *)0x0 || __rhs == (char *)0x0) {
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+(&local_70,"The project file for target [",psVar3);
    std::operator+(&local_90,&local_70,"] is missing.\n");
    std::__cxx11::string::~string((string *)&local_70);
    cmSystemTools::Error(&local_90);
    poVar4 = std::operator<<(fout,"{comment} ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::operator<<(poVar4," [missing project file]\n");
  }
  else {
    this_00 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
    cmLocalGenerator::MaybeConvertToRelativePath(&local_70,root,rootBinaryDir,&local_90);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    bVar1 = std::operator==(&local_90,".");
    if (bVar1) {
      local_90._M_string_length = 0;
      *local_90._M_dataplus._M_p = '\0';
    }
    else if (local_90._M_dataplus._M_p[local_90._M_string_length - 1] != '/') {
      std::__cxx11::string::append((char *)&local_90);
    }
    std::operator+(&local_50,&local_90,__rhs);
    std::operator+(&local_70,&local_50,FILE_EXTENSION);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator<<(fout,(string *)&local_70);
    poVar4 = std::operator<<(fout," ");
    poVar4 = std::operator<<(poVar4,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteProjectLine(
  std::ostream& fout, cmGeneratorTarget const* target, cmLocalGenerator* root,
  std::string& rootBinaryDir)
{
  const char* projName = target->GetProperty("GENERATOR_FILE_NAME");
  const char* projType = target->GetProperty("GENERATOR_FILE_NAME_EXT");
  if (projName && projType) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::string dir = lg->GetCurrentBinaryDirectory();
    dir = root->MaybeConvertToRelativePath(rootBinaryDir, dir);
    if (dir == ".") {
      dir.clear();
    } else {
      if (dir.back() != '/') {
        dir += "/";
      }
    }

    std::string projFile = dir + projName + FILE_EXTENSION;
    fout << projFile;
    fout << " " << projType << std::endl;
  } else {
    /* Should never happen */
    std::string message =
      "The project file for target [" + target->GetName() + "] is missing.\n";
    cmSystemTools::Error(message);
    fout << "{comment} " << target->GetName() << " [missing project file]\n";
  }
}